

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  uint uVar2;
  char local_25 [5];
  void *pvStack_20;
  char string [5];
  Slot *slot;
  uint codepoint_local;
  GLFWwindow *window_local;
  
  pvStack_20 = glfwGetWindowUserPointer(window);
  memset(local_25,0,5);
  encode_utf8(local_25,codepoint);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvStack_20 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",(ulong)uVar2,(ulong)uVar1,
         (ulong)codepoint,local_25);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    char string[5] = "";

    encode_utf8(string, codepoint);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",
           counter++, slot->number, glfwGetTime(), codepoint, string);
}